

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O2

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *
vkt::pipeline::createQuadMosaicCubeArray
          (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           *__return_storage_ptr__,int *faceArrayIndices)

{
  int iVar1;
  pointer pVVar2;
  int quadNdx;
  long lVar3;
  long lVar4;
  
  createQuadMosaicCube();
  pVVar2 = (__return_storage_ptr__->
           super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    iVar1 = faceArrayIndices[lVar3];
    for (lVar4 = 0; (int)lVar4 != 0xc0; lVar4 = lVar4 + 0x20) {
      *(float *)((long)(pVVar2->texCoord).m_data + lVar4 + 0xc) = (float)iVar1;
    }
    pVVar2 = (pointer)((long)(pVVar2->position).m_data + lVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4Tex4> createQuadMosaicCubeArray (int faceArrayIndices[6])
{
	std::vector<Vertex4Tex4>			vertices	= createQuadMosaicCube();
	std::vector<Vertex4Tex4>::iterator	vertexItr	= vertices.begin();

	for (int quadNdx = 0; quadNdx < 6; quadNdx++)
	{
		for (int vertexNdx = 0; vertexNdx < 6; vertexNdx++)
		{
			vertexItr->texCoord.w() = (float)faceArrayIndices[quadNdx];
			vertexItr++;
		}
	}

	return vertices;
}